

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalNinjaGenerator::ComputeTargetObjectDirectory
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *gt)

{
  cmTarget *pcVar1;
  string dir;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = gt->Target;
  local_50 = 0;
  local_48 = 0;
  local_58 = &local_48;
  cmMakefile::GetCurrentBinaryDirectory(gt->Makefile);
  std::__cxx11::string::append((char *)&local_58);
  std::__cxx11::string::append((char *)&local_58);
  (*gt->LocalGenerator->_vptr_cmLocalGenerator[0xc])(local_38,gt->LocalGenerator,pcVar1);
  std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_38[0]);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  std::__cxx11::string::append((char *)&local_58);
  std::__cxx11::string::_M_assign((string *)&gt->ObjectDirectory);
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator
::ComputeTargetObjectDirectory(cmGeneratorTarget* gt) const
{
  cmTarget* target = gt->Target;

  // Compute full path to object file directory for this target.
  std::string dir;
  dir += gt->Makefile->GetCurrentBinaryDirectory();
  dir += "/";
  dir += gt->LocalGenerator->GetTargetDirectory(*target);
  dir += "/";
  gt->ObjectDirectory = dir;
}